

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

void __thiscall
CCoinsViewCache::AddCoin
          (CCoinsViewCache *this,COutPoint *outpoint,Coin *coin,bool possible_overwrite)

{
  bool bVar1;
  _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> _Var2;
  size_t sVar3;
  logic_error *this_00;
  uint8_t flags;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar4;
  undefined1 local_41;
  COutPoint *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((coin->out).nValue == -1) {
    __assert_fail("!coin.IsSpent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/coins.cpp"
                  ,0x47,"void CCoinsViewCache::AddCoin(const COutPoint &, Coin &&, bool)");
  }
  bVar1 = CScript::IsUnspendable(&(coin->out).scriptPubKey);
  if (!bVar1) {
    local_40 = outpoint;
    pVar4 = std::
            _Hashtable<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::piecewise_construct_t_const&,std::tuple<COutPoint_const&>,std::tuple<>>
                      ((_Hashtable<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->cacheCoins,&std::piecewise_construct,&local_40,&local_41);
    _Var2 = pVar4.first.
            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>._M_cur;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      sVar3 = Coin::DynamicMemoryUsage
                        ((Coin *)((long)_Var2.
                                        super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                        ._M_cur + 0x48));
      this->cachedCoinsUsage = this->cachedCoinsUsage - sVar3;
    }
    flags = '\x01';
    if (!possible_overwrite) {
      if (*(long *)((long)_Var2.
                          super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                          ._M_cur + 0x48) != -1) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,
                   "Attempted to overwrite an unspent coin (when possible_overwrite is false)");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        goto LAB_00359d2a;
      }
      flags = ((*(byte *)((long)_Var2.
                                super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                ._M_cur + 0x40) & 1) == 0) * '\x02' + '\x01';
    }
    Coin::operator=((Coin *)((long)_Var2.
                                   super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                   ._M_cur + 0x48),coin);
    CCoinsCacheEntry::AddFlags
              ((CCoinsCacheEntry *)
               ((long)_Var2.
                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                      ._M_cur + 0x30),flags,
               (CoinsCachePair *)
               ((long)_Var2.
                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                      ._M_cur + 8),&this->m_sentinel);
    sVar3 = Coin::DynamicMemoryUsage
                      ((Coin *)((long)_Var2.
                                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                      ._M_cur + 0x48));
    this->cachedCoinsUsage = this->cachedCoinsUsage + sVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00359d2a:
  __stack_chk_fail();
}

Assistant:

void CCoinsViewCache::AddCoin(const COutPoint &outpoint, Coin&& coin, bool possible_overwrite) {
    assert(!coin.IsSpent());
    if (coin.out.scriptPubKey.IsUnspendable()) return;
    CCoinsMap::iterator it;
    bool inserted;
    std::tie(it, inserted) = cacheCoins.emplace(std::piecewise_construct, std::forward_as_tuple(outpoint), std::tuple<>());
    bool fresh = false;
    if (!inserted) {
        cachedCoinsUsage -= it->second.coin.DynamicMemoryUsage();
    }
    if (!possible_overwrite) {
        if (!it->second.coin.IsSpent()) {
            throw std::logic_error("Attempted to overwrite an unspent coin (when possible_overwrite is false)");
        }
        // If the coin exists in this cache as a spent coin and is DIRTY, then
        // its spentness hasn't been flushed to the parent cache. We're
        // re-adding the coin to this cache now but we can't mark it as FRESH.
        // If we mark it FRESH and then spend it before the cache is flushed
        // we would remove it from this cache and would never flush spentness
        // to the parent cache.
        //
        // Re-adding a spent coin can happen in the case of a re-org (the coin
        // is 'spent' when the block adding it is disconnected and then
        // re-added when it is also added in a newly connected block).
        //
        // If the coin doesn't exist in the current cache, or is spent but not
        // DIRTY, then it can be marked FRESH.
        fresh = !it->second.IsDirty();
    }
    it->second.coin = std::move(coin);
    it->second.AddFlags(CCoinsCacheEntry::DIRTY | (fresh ? CCoinsCacheEntry::FRESH : 0), *it, m_sentinel);
    cachedCoinsUsage += it->second.coin.DynamicMemoryUsage();
    TRACE5(utxocache, add,
           outpoint.hash.data(),
           (uint32_t)outpoint.n,
           (uint32_t)it->second.coin.nHeight,
           (int64_t)it->second.coin.out.nValue,
           (bool)it->second.coin.IsCoinBase());
}